

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O3

void aom_highbd_dc_predictor_16x32_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  int iVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  ushort uVar9;
  undefined1 in_XMM1 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  uVar2 = left[5];
  uVar3 = left[7];
  auVar8 = *(undefined1 (*) [16])(left + 8);
  auVar13 = *(undefined1 (*) [16])(left + 0x18);
  auVar16._0_2_ = left[4] + *left;
  auVar16._2_2_ = uVar2 + left[1];
  auVar16._4_2_ = left[6] + left[2];
  auVar16._6_2_ = uVar3 + left[3];
  auVar16._8_2_ = left[4];
  auVar16._10_2_ = uVar2;
  auVar16._12_2_ = left[6];
  auVar16._14_2_ = uVar3;
  auVar7 = pshuflw(in_XMM1,auVar16,0xe);
  uVar9 = auVar7._2_2_ + auVar16._2_2_;
  auVar6._2_2_ = 0;
  auVar6._0_2_ = uVar9;
  auVar6._4_4_ = (uint)(((ulong)(ushort)(auVar7._6_2_ + auVar16._6_2_) << 0x30) >> 0x30);
  auVar6._8_4_ = (uint)(((uint6)(ushort)(auVar7._10_2_ + uVar2) << 0x20) >> 0x20);
  auVar6._12_4_ = (uint)(((uint6)(ushort)(auVar7._14_2_ + uVar3) << 0x20) >> 0x20);
  auVar17._0_2_ = auVar8._8_2_ + auVar8._0_2_;
  auVar17._2_2_ = auVar8._10_2_ + auVar8._2_2_;
  auVar17._4_2_ = auVar8._12_2_ + auVar8._4_2_;
  auVar17._6_2_ = auVar8._14_2_ + auVar8._6_2_;
  auVar17._8_2_ = auVar8._8_2_;
  auVar17._10_2_ = auVar8._10_2_;
  auVar17._12_2_ = auVar8._12_2_;
  auVar17._14_2_ = auVar8._14_2_;
  auVar11 = pshuflw(auVar8,auVar17,0xe);
  auVar12._0_2_ = left[0x14] + left[0x10];
  auVar12._2_2_ = left[0x15] + left[0x11];
  auVar12._4_2_ = left[0x16] + left[0x12];
  auVar12._6_2_ = left[0x17] + left[0x13];
  auVar12._8_2_ = left[0x14];
  auVar12._10_2_ = left[0x15];
  auVar12._12_2_ = left[0x16];
  auVar12._14_2_ = left[0x17];
  auVar6 = pshuflw(auVar6,auVar12,0xe);
  auVar14._0_2_ = auVar13._8_2_ + auVar13._0_2_;
  auVar14._2_2_ = auVar13._10_2_ + auVar13._2_2_;
  auVar14._4_2_ = auVar13._12_2_ + auVar13._4_2_;
  auVar14._6_2_ = auVar13._14_2_ + auVar13._6_2_;
  auVar14._8_2_ = auVar13._8_2_;
  auVar14._10_2_ = auVar13._10_2_;
  auVar14._12_2_ = auVar13._12_2_;
  auVar14._14_2_ = auVar13._14_2_;
  auVar10 = pshuflw(auVar13,auVar14,0xe);
  auVar8 = *(undefined1 (*) [16])above;
  auVar13 = *(undefined1 (*) [16])(above + 8);
  auVar15._0_2_ = auVar8._8_2_ + auVar8._0_2_;
  auVar15._2_2_ = auVar8._10_2_ + auVar8._2_2_;
  auVar15._4_2_ = auVar8._12_2_ + auVar8._4_2_;
  auVar15._6_2_ = auVar8._14_2_ + auVar8._6_2_;
  auVar15._8_2_ = auVar8._8_2_;
  auVar15._10_2_ = auVar8._10_2_;
  auVar15._12_2_ = auVar8._12_2_;
  auVar15._14_2_ = auVar8._14_2_;
  auVar8 = pshuflw(auVar8,auVar15,0xe);
  auVar18._0_2_ = auVar13._8_2_ + auVar13._0_2_;
  auVar18._2_2_ = auVar13._10_2_ + auVar13._2_2_;
  auVar18._4_2_ = auVar13._12_2_ + auVar13._4_2_;
  auVar18._6_2_ = auVar13._14_2_ + auVar13._6_2_;
  auVar18._8_2_ = auVar13._8_2_;
  auVar18._10_2_ = auVar13._10_2_;
  auVar18._12_2_ = auVar13._12_2_;
  auVar18._14_2_ = auVar13._14_2_;
  auVar13 = pshuflw(auVar13,auVar18,0xe);
  auVar8 = ZEXT416(((uint)(ushort)(auVar8._0_2_ + auVar15._0_2_ + auVar13._0_2_ + auVar18._0_2_ +
                                   auVar8._2_2_ + auVar15._2_2_ + auVar13._2_2_ + auVar18._2_2_) +
                    (uint)(ushort)(auVar6._0_2_ + auVar12._0_2_ + auVar10._0_2_ + auVar14._0_2_ +
                                   auVar6._2_2_ + auVar12._2_2_ + auVar10._2_2_ + auVar14._2_2_) +
                    (uint)(ushort)(auVar7._0_2_ + auVar16._0_2_ + auVar11._0_2_ + auVar17._0_2_ +
                                   uVar9 + auVar11._2_2_ + auVar17._2_2_) + 0x18) / 0x30);
  auVar8 = pshuflw(auVar8,auVar8,0);
  uVar5 = auVar8._0_4_;
  iVar4 = 8;
  do {
    *(undefined4 *)dst = uVar5;
    *(undefined4 *)(dst + 2) = uVar5;
    *(undefined4 *)(dst + 4) = uVar5;
    *(undefined4 *)(dst + 6) = uVar5;
    *(undefined4 *)(dst + 8) = uVar5;
    *(undefined4 *)(dst + 10) = uVar5;
    *(undefined4 *)(dst + 0xc) = uVar5;
    *(undefined4 *)(dst + 0xe) = uVar5;
    puVar1 = dst + stride;
    *(undefined4 *)puVar1 = uVar5;
    *(undefined4 *)(puVar1 + 2) = uVar5;
    *(undefined4 *)(puVar1 + 4) = uVar5;
    *(undefined4 *)(puVar1 + 6) = uVar5;
    puVar1 = dst + stride + 8;
    *(undefined4 *)puVar1 = uVar5;
    *(undefined4 *)(puVar1 + 2) = uVar5;
    *(undefined4 *)(puVar1 + 4) = uVar5;
    *(undefined4 *)(puVar1 + 6) = uVar5;
    puVar1 = dst + stride * 2;
    *(undefined4 *)puVar1 = uVar5;
    *(undefined4 *)(puVar1 + 2) = uVar5;
    *(undefined4 *)(puVar1 + 4) = uVar5;
    *(undefined4 *)(puVar1 + 6) = uVar5;
    puVar1 = dst + stride * 2 + 8;
    *(undefined4 *)puVar1 = uVar5;
    *(undefined4 *)(puVar1 + 2) = uVar5;
    *(undefined4 *)(puVar1 + 4) = uVar5;
    *(undefined4 *)(puVar1 + 6) = uVar5;
    puVar1 = dst + stride * 3;
    *(undefined4 *)puVar1 = uVar5;
    *(undefined4 *)(puVar1 + 2) = uVar5;
    *(undefined4 *)(puVar1 + 4) = uVar5;
    *(undefined4 *)(puVar1 + 6) = uVar5;
    puVar1 = dst + stride * 3 + 8;
    *(undefined4 *)puVar1 = uVar5;
    *(undefined4 *)(puVar1 + 2) = uVar5;
    *(undefined4 *)(puVar1 + 4) = uVar5;
    *(undefined4 *)(puVar1 + 6) = uVar5;
    dst = dst + stride * 4;
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  return;
}

Assistant:

void aom_highbd_dc_predictor_16x32_sse2(uint16_t *dst, ptrdiff_t stride,
                                        const uint16_t *above,
                                        const uint16_t *left, int bd) {
  (void)bd;
  __m128i sum_left = dc_sum_32(left);
  __m128i sum_above = dc_sum_16(above);
  const __m128i zero = _mm_setzero_si128();
  sum_above = _mm_unpacklo_epi16(sum_above, zero);
  const __m128i sum = _mm_add_epi32(sum_left, sum_above);
  uint32_t sum32 = (uint32_t)_mm_cvtsi128_si32(sum);
  sum32 += 24;
  sum32 /= 48;
  const __m128i row = _mm_set1_epi16((int16_t)sum32);
  int i;
  for (i = 0; i < 8; ++i) {
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    dst += stride;
  }
}